

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O2

void __thiscall iDynTree::SubModelDecomposition::~SubModelDecomposition(SubModelDecomposition *this)

{
  setNrOfSubModels(this,0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->link2subModelIndex).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::~_Vector_base
            ((_Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_> *)this);
  return;
}

Assistant:

SubModelDecomposition::~SubModelDecomposition()
{
    this->setNrOfSubModels(0);
}